

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_cid.c
# Opt level: O2

int quicly_remote_cid_unregister(quicly_remote_cid_set_t *set,uint64_t sequence)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  size_t idx_to_unreg;
  uint64_t *puVar5;
  ulong idx_to_promote;
  
  puVar5 = &set->cids[0].sequence;
  idx_to_promote = 0xffffffffffffffff;
  idx_to_unreg = 0;
  uVar3 = idx_to_promote;
  while( true ) {
    if (idx_to_unreg == 4) {
      if (set->cids[0].is_active == 0) {
        iVar2 = 0;
        if (idx_to_promote != 0xffffffffffffffff) {
          promote_cid(set,idx_to_promote);
        }
      }
      else {
        iVar2 = 1;
      }
      return iVar2;
    }
    if ((*puVar5 == sequence) && (do_unregister(set,idx_to_unreg), idx_to_unreg != 0)) break;
    uVar4 = uVar3;
    if (((quicly_remote_cid_t *)(puVar5 + -1))->is_active != 0) {
      uVar1 = *puVar5;
      if (uVar1 <= uVar3) {
        uVar4 = uVar1;
      }
      if (uVar1 < uVar3) {
        idx_to_promote = idx_to_unreg;
      }
    }
    idx_to_unreg = idx_to_unreg + 1;
    puVar5 = puVar5 + 7;
    uVar3 = uVar4;
  }
  return 0;
}

Assistant:

int quicly_remote_cid_unregister(quicly_remote_cid_set_t *set, uint64_t sequence)
{
    uint64_t min_seq = UINT64_MAX;
    size_t min_seq_idx = SIZE_MAX;
    for (size_t i = 0; i < PTLS_ELEMENTSOF(set->cids); i++) {
        if (sequence == set->cids[i].sequence) {
            do_unregister(set, i);
            if (i != 0)
                return 0; /* if not retiring idx=0 (current in-use CID), simply return */
        }
        if (set->cids[i].is_active && min_seq > set->cids[i].sequence) {
            /* find a CID with minimum sequence number, while iterating over the array */
            min_seq = set->cids[i].sequence;
            min_seq_idx = i;
        }
    }

    if (!set->cids[0].is_active) {
        /* we have retired the current CID (idx=0) */
        if (min_seq_idx != SIZE_MAX)
            promote_cid(set, min_seq_idx);
        return 0;
    } else {
        /* we did not unregister any slot */
        return 1;
    }
}